

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::converter::ProtoWriter::ValidOneof
          (ProtoWriter *this,Field *field,StringPiece unnormalized_name)

{
  uint uVar1;
  ProtoElement *pPVar2;
  long lVar3;
  ulong uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  Type *pTVar7;
  LocationTrackerInterface *pLVar8;
  char *e;
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string local_48;
  
  pPVar2 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
           ._M_head_impl;
  bVar6 = true;
  if (pPVar2 != (ProtoElement *)0x0) {
    uVar1 = field->oneof_index_;
    if (0 < (int)uVar1) {
      lVar3 = *(long *)&(pPVar2->oneof_indices_).super__Bvector_base<std::allocator<bool>_>._M_impl;
      uVar4 = *(ulong *)(lVar3 + (ulong)(uVar1 >> 6) * 8);
      if ((uVar4 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        *(ulong *)(lVar3 + (ulong)(uVar1 >> 6) * 8) = uVar4 | 1L << ((byte)uVar1 & 0x3f);
      }
      else {
        e = "oneof field \'";
        pTVar7 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&(pPVar2->type_->oneofs_).super_RepeatedPtrFieldBase,uVar1 - 1);
        local_108.piece_data_ = (pTVar7->_M_dataplus)._M_p;
        local_108.piece_size_ = pTVar7->_M_string_length;
        local_d8.piece_data_ = "\' is already set. Cannot set \'";
        local_d8.piece_size_ = 0x1e;
        local_78.piece_data_ = "\'";
        local_78.piece_size_ = 1;
        local_a8.piece_data_ = unnormalized_name.ptr_;
        local_a8.piece_size_ = unnormalized_name.length_;
        StrCat_abi_cxx11_(&local_48,(protobuf *)&stack0xfffffffffffffec8,&local_108,&local_d8,
                          &local_a8,&local_78,(AlphaNum *)e);
        _Var5._M_p = local_48._M_dataplus._M_p;
        if ((long)local_48._M_string_length < 0) {
          StringPiece::LogFatalSizeTooBig(local_48._M_string_length,"size_t to int conversion");
        }
        pPVar2 = (this->element_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                 ._M_head_impl;
        if (pPVar2 == (ProtoElement *)0x0) {
          pLVar8 = (this->tracker_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   .
                   super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                   ._M_head_impl;
        }
        else {
          pLVar8 = &pPVar2->super_LocationTrackerInterface;
        }
        (*this->listener_->_vptr_ErrorListener[3])
                  (this->listener_,pLVar8,"oneof",5,_Var5._M_p,local_48._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        bVar6 = false;
      }
    }
  }
  return bVar6;
}

Assistant:

bool ProtoWriter::ValidOneof(const google::protobuf::Field& field,
                             StringPiece unnormalized_name) {
  if (element_ == nullptr) return true;

  if (field.oneof_index() > 0) {
    if (element_->IsOneofIndexTaken(field.oneof_index())) {
      InvalidValue(
          "oneof",
          StrCat(
              "oneof field '", element_->type().oneofs(field.oneof_index() - 1),
              "' is already set. Cannot set '", unnormalized_name, "'"));
      return false;
    }
    element_->TakeOneofIndex(field.oneof_index());
  }
  return true;
}